

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b3fcdf::X509Test_NoBasicConstraintsCertSign_Test::TestBody
          (X509Test_NoBasicConstraintsCertSign_Test *this)

{
  void *pvVar1;
  int iVar2;
  char *message;
  char *in_R9;
  _Any_data *configure_callback;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  UniquePtr<X509> intermediate;
  UniquePtr<X509> leaf;
  UniquePtr<X509> root;
  AssertHelper local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  pointer local_b0;
  string local_a8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_88;
  _Head_base<0UL,_x509_st_*,_false> local_70;
  allocator_type local_62;
  allocator_type local_61;
  _Head_base<0UL,_x509_st_*,_false> local_60;
  _Head_base<0UL,_x509_st_*,_false> local_58;
  int local_50;
  int local_4c;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  _Head_base<0UL,_x509_st_*,_false> local_20;
  x509_st *local_18;
  
  CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_58,
              "\n-----BEGIN CERTIFICATE-----\nMIICTTCCAbagAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwKzEXMBUGA1UE\nChMOQm9yaW5nU1NMIFRlc3QxEDAOBgNVBAMTB1Jvb3QgQ0EwHhcNMTUwMTAxMDAw\nMDAwWhcNMjUwMTAxMDAwMDAwWjArMRcwFQYDVQQKEw5Cb3JpbmdTU0wgVGVzdDEQ\nMA4GA1UEAxMHUm9vdCBDQTCBnzANBgkqhkiG9w0BAQEFAAOBjQAwgYkCgYEA6Q5/\nEQzmWuaGg3D2UQcuAngR9bIkkjjuJmICx5TxPqF3asCP1SJotl3iTNrghRE1wpJy\nSY2BtIiXa7f8skRb2U0GcPkMxo/ps9+jaoRsQ1m+nbLQdpvD1/qZWcO45fNTA71J\n1rPMokP+rcILuQG4VimUAySnDSghKamulFtK+Z8CAwEAAaN6MHgwDgYDVR0PAQH/\nBAQDAgIEMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAPBgNVHRMBAf8E\nBTADAQH/MBkGA1UdDgQSBBBAN9cB+0AvuBx+VAQnjFkBMBsGA1UdIwQUMBKAEEA3\n1wH7QC+4HH5UBCeMWQEwDQYJKoZIhvcNAQELBQADgYEAc4N6hTE62/3gwg+kyc2f\nc/Jj1mHrOt+0NRaBnmvbmNpsEjHS96Ef4Wt/ZlPXPkkv1C1VosJnOIMF3Q522wRH\nbqaxARldS12VAa3gcWisDWD+SqSyDxjyojz0XDiJkTrFuCTCUiZO+1GLB7SO10Ms\nd5YVX0c90VMnUhF/dlrqS9U=\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_70,
              "\n-----BEGIN CERTIFICATE-----\nMIIBqjCCAROgAwIBAgIBAjANBgkqhkiG9w0BAQsFADArMRcwFQYDVQQKEw5Cb3Jp\nbmdTU0wgVGVzdDEQMA4GA1UEAxMHUm9vdCBDQTAgFw0wMDAxMDEwMDAwMDBaGA8y\nMDk5MDEwMTAwMDAwMFowHzEdMBsGA1UEAxMUTm8gQmFzaWMgQ29uc3RyYWludHMw\nWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASEFMblfxIEDO8My7wHtHWTuDzNyID1\nOsPkMGkn32O/pSyXxXuAqDeFoMVffUMTyfm8JcYugSEbrv2qEXXM4bZRoy8wLTAO\nBgNVHQ8BAf8EBAMCAgQwGwYDVR0jBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkq\nhkiG9w0BAQsFAAOBgQC1Lh6hIAm3K5kRh5iIydU0YAEm7eV6ZSskERDUq3DLJyl9\nZUZCHUzvb464dkwZjeNzaUVS1pdElJslwX3DtGgeJLJGCnk8zUjBjaNrrDm0kzPW\nxKt/6oif1ci/KCKqKNXJAIFbc4e+IiBpenwpxHk3If4NM+Ek0nKoO8Uj0NkgTQ==\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_b3fcdf *)&local_60,
              "\n-----BEGIN CERTIFICATE-----\nMIIBUDCB96ADAgECAgEDMAoGCCqGSM49BAMCMB8xHTAbBgNVBAMTFE5vIEJhc2lj\nIENvbnN0cmFpbnRzMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAx\nMS8wLQYDVQQDEyZMZWFmIGZyb20gQ0Egd2l0aCBubyBCYXNpYyBDb25zdHJhaW50\nczBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABEsYPMwzdJKjB+2gpC90ib2ilHoB\nw/arQ6ikUX0CNUDDaKaOu/jF39ogzVlg4lDFrjCKShSfCCcrwgONv70IZGijEDAO\nMAwGA1UdEwEB/wQCMAAwCgYIKoZIzj0EAwIDSAAwRQIgbV7R99yM+okXSIs6Fp3o\neCOXiDL60IBxaTOcLS44ywcCIQDbn87Gj5cFgHBYAkzdHqDsyGXkxQTHDq9jmX24\nDjy3Zw==\n-----END CERTIFICATE-----\n"
             );
  local_c0[0] = (internal)(local_58._M_head_impl != (x509_st *)0x0);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_head_impl == (x509_st *)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_c0,(AssertionResult *)0x5a65c3,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xb73,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_88);
  }
  else {
    local_c0[0] = (internal)((X509 *)local_70._M_head_impl != (X509 *)0x0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((X509 *)local_70._M_head_impl == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)local_c0,(AssertionResult *)0x5841ab,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xb74,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_88);
    }
    else {
      local_c0[0] = (internal)(local_60._M_head_impl != (X509 *)0x0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_60._M_head_impl == (X509 *)0x0) {
        testing::Message::Message((Message *)&local_88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a8,(internal *)local_c0,(AssertionResult *)0x5841e9,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xb75,local_a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_88);
      }
      else {
        local_50 = 0x18;
        local_18 = local_58._M_head_impl;
        __l._M_len = 1;
        __l._M_array = &local_18;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_a8,__l,&local_61);
        local_20._M_head_impl = local_70._M_head_impl;
        __l_00._M_len = 1;
        __l_00._M_array = &local_20._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_c0,__l_00,&local_62);
        local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        configure_callback = &local_48;
        local_48._M_unused._M_object = (void *)0x0;
        local_48._8_8_ = 0;
        local_38 = (code *)0x0;
        uStack_30 = 0;
        local_4c = Verify(local_60._M_head_impl,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_a8,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_c0,&local_88,0,
                          (function<void_(x509_store_ctx_st_*)> *)configure_callback);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_d0,"24",
                   "Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0)",&local_50,
                   &local_4c);
        if (local_38 != (code *)0x0) {
          (*local_38)(&local_48,&local_48,__destroy_functor);
        }
        pvVar1 = (void *)CONCAT71(local_c0._1_7_,local_c0[0]);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)local_b0 - (long)pvVar1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_a8._M_dataplus._M_p,
                          local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
        }
        if (local_d0.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_a8);
          if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = "";
          }
          else {
            message = (local_c8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb7a,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_a8._M_dataplus._M_p + 8))();
          }
        }
        if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c8,local_c8);
        }
        iVar2 = X509_check_purpose((X509 *)local_70._M_head_impl,-1,1);
        local_c0[0] = (internal)(iVar2 != 0);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_c0[0]) {
          testing::Message::Message((Message *)&local_88);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,(internal *)local_c0,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), -1, 1)","false",
                     "true",configure_callback->_M_pod_data);
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb7f,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b8,local_b8);
          }
        }
        iVar2 = X509_check_purpose((X509 *)local_70._M_head_impl,7,1);
        local_c0[0] = (internal)(iVar2 != 0);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_c0[0]) {
          testing::Message::Message((Message *)&local_88);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,(internal *)local_c0,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), 7, 1)","false",
                     "true",configure_callback->_M_pod_data);
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb81,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b8,local_b8);
          }
        }
        iVar2 = X509_check_purpose((X509 *)local_70._M_head_impl,2,1);
        local_c0[0] = (internal)(iVar2 == 0);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_c0[0]) goto LAB_003b0c72;
        testing::Message::Message((Message *)&local_88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a8,(internal *)local_c0,
                   (AssertionResult *)"X509_check_purpose(intermediate.get(), 2, 1)","true","false",
                   configure_callback->_M_pod_data);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xb83,local_a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_88);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)(*local_88.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start)->sig_alg)();
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
LAB_003b0c72:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_60);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_70);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_58);
  return;
}

Assistant:

TEST(X509Test, NoBasicConstraintsCertSign) {
  bssl::UniquePtr<X509> root(CertFromPEM(kSANTypesRoot));
  bssl::UniquePtr<X509> intermediate(
      CertFromPEM(kNoBasicConstraintsCertSignIntermediate));
  bssl::UniquePtr<X509> leaf(CertFromPEM(kNoBasicConstraintsCertSignLeaf));

  ASSERT_TRUE(root);
  ASSERT_TRUE(intermediate);
  ASSERT_TRUE(leaf);

  // The intermediate has keyUsage certSign, but is not marked as a CA in the
  // basicConstraints.
  EXPECT_EQ(X509_V_ERR_INVALID_CA,
            Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0));

  // |X509_check_purpose| with |X509_PURPOSE_ANY| and purpose -1 do not check
  // basicConstraints, but other purpose types do. (This is redundant with the
  // actual basicConstraints check, but |X509_check_purpose| is public API.)
  EXPECT_TRUE(X509_check_purpose(intermediate.get(), -1, /*ca=*/1));
  EXPECT_TRUE(
      X509_check_purpose(intermediate.get(), X509_PURPOSE_ANY, /*ca=*/1));
  EXPECT_FALSE(X509_check_purpose(intermediate.get(), X509_PURPOSE_SSL_SERVER,
                                  /*ca=*/1));
}